

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_rotate_im(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 shift_00;
  TCGv_i32 X_00;
  TCGv_i32 X;
  int left;
  int tmp;
  TCGv_i32 shift;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  X._4_4_ = (int)(uint)insn >> 9 & 7;
  if (X._4_4_ == 0) {
    X._4_4_ = 8;
  }
  shift_00 = tcg_const_i32_m68k(tcg_ctx_00,X._4_4_);
  if ((insn & 8) == 0) {
    X_00 = rotate32_x(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],shift_00,insn & 0x100);
    rotate_x_flags(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],X_00,0x20);
    tcg_temp_free_i32(tcg_ctx_00,X_00);
  }
  else {
    rotate(tcg_ctx_00,tcg_ctx_00->cpu_dregs[(int)(insn & 7)],shift_00,insn & 0x100,0x20);
  }
  tcg_temp_free_i32(tcg_ctx_00,shift_00);
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

DISAS_INSN(rotate_im)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv shift;
    int tmp;
    int left = (insn & 0x100);

    tmp = (insn >> 9) & 7;
    if (tmp == 0) {
        tmp = 8;
    }

    shift = tcg_const_i32(tcg_ctx, tmp);
    if (insn & 8) {
        rotate(tcg_ctx, DREG(insn, 0), shift, left, 32);
    } else {
        TCGv X = rotate32_x(tcg_ctx, DREG(insn, 0), shift, left);
        rotate_x_flags(tcg_ctx, DREG(insn, 0), X, 32);
        tcg_temp_free(tcg_ctx, X);
    }
    tcg_temp_free(tcg_ctx, shift);

    set_cc_op(s, CC_OP_FLAGS);
}